

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O2

bool cal_run(void)

{
  int iVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  duration dVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  int iVar10;
  long lVar11;
  uint gridSz;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  
  dVar5.__r = std::chrono::_V2::system_clock::now();
  lVar6 = (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar7 = ((long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x38;
  logtime.__d.__r = (duration)(duration)dVar5.__r;
  std::
  __sort<__gnu_cxx::__normal_iterator<Grid*,std::vector<Grid,std::allocator<Grid>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Grid_const&,Grid_const&)>>
            ((__normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_>)
             gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_>)
             gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data
             ._M_finish,(_Iter_comp_iter<bool_(*)(const_Grid_&,_const_Grid_&)>)0x10bcd2);
  std::
  __sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
            ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
             planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
             planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10bcdc);
  iVar10 = -(uint)(0x32 < tarAirSupremacy);
  gridSz = (uint)(lVar6 / 0x18);
  uVar13 = (uint)uVar7;
  uVar3 = uVar13;
  if ((int)gridSz < (int)uVar13) {
    uVar3 = gridSz;
  }
  uVar14 = 0;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar14;
  }
  fVar16 = 50.0;
  lVar6 = 0x24;
  iVar12 = 1;
  for (; uVar8 * 0x18 != uVar14; uVar14 = uVar14 + 0x18) {
    iVar4 = *(int *)((long)&((planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                              super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar6);
    iVar1 = 3;
    if (*(int *)((long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar6 + -4) == 3) {
      iVar1 = 0x19;
    }
    dVar2 = (double)*(int *)((long)&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl
                                     .super__Vector_impl_data._M_start)->gridSize + uVar14);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    fVar16 = fVar16 + (float)(iVar1 + (int)((double)iVar4 * dVar2));
    iVar4 = iVar10;
    if (iVar10 == -1) {
      iVar4 = iVar12;
    }
    if ((float)tarAirSupremacy <= fVar16) {
      iVar10 = iVar4;
    }
    lVar6 = lVar6 + 0x38;
    iVar12 = iVar12 + 1;
  }
  fVar16 = 0.0;
  lVar6 = 8;
  iVar12 = 0;
  for (lVar11 = 0; uVar8 * 0x38 != lVar11; lVar11 = lVar11 + 0x38) {
    if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                         super__Vector_impl_data._M_start)->category + lVar11) == 3) {
      iVar12 = iVar12 + 1;
      std::vector<Plane,_std::allocator<Plane>_>::push_back
                (&planeVecF,
                 (value_type *)
                 ((long)&((planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar11));
      iVar4 = 3;
      if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_start)->category + lVar11) == 3) {
        iVar4 = 0x19;
      }
    }
    else {
      iVar4 = 3;
    }
    iVar1 = *(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                             super__Vector_impl_data._M_start)->airSupremacy + lVar11);
    dVar2 = (double)*(int *)((long)&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl
                                     .super__Vector_impl_data._M_start)->carrierPos + lVar6);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    fVar16 = fVar16 + (float)(iVar4 + (int)((double)iVar1 * dVar2));
    lVar6 = lVar6 + 0x18;
  }
  fVar15 = (float)tarAirSupremacy;
  if (fVar16 < fVar15) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "ERROR:FighterPower unreachable.Currently reachable FighterPower: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar16);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    iVar4 = 0x10;
    if (iVar12 < 0x10) {
      iVar4 = iVar12;
    }
    curFighterNum = iVar10;
    if (iVar4 < iVar10) {
      curFighterNum = iVar4;
    }
    uVar7 = uVar7 & 0xffffffff;
    if ((int)uVar13 < 1) {
      uVar7 = 0;
    }
    for (; curFighterNum <= iVar4; curFighterNum = curFighterNum + 1) {
      std::vector<Plane,_std::allocator<Plane>_>::clear(&planeVecA);
      for (lVar6 = 0; uVar7 * 0x38 - lVar6 != 0; lVar6 = lVar6 + 0x38) {
        if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                             super__Vector_impl_data._M_start)->category + lVar6) - 1U < 2) {
          std::vector<Plane,_std::allocator<Plane>_>::push_back
                    (&planeVecA,
                     (value_type *)
                     ((long)&((planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                               super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar6));
        }
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                 planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                 planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10bcfe);
      iVar10 = (int)(((long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x38);
      curBomberNum = gridSz - curFighterNum;
      if (iVar10 <= (int)(gridSz - curFighterNum)) {
        curBomberNum = iVar10;
      }
      if (attackerAbleGridNum < curBomberNum) {
        curBomberNum = attackerAbleGridNum;
      }
      flushFlag = true;
      std::
      __sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                 planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                 super__Vector_impl_data._M_start + curBomberNum,
                 (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10bd7b);
      atkdp(curBomberNum);
      sign[0x1c] = 0;
      sign[0x1d] = 0;
      sign[0x1e] = 0;
      sign[0x1f] = 0;
      sign[0x18] = 0;
      sign[0x19] = 0;
      sign[0x1a] = 0;
      sign[0x1b] = 0;
      sign[0x14] = 0;
      sign[0x15] = 0;
      sign[0x16] = 0;
      sign[0x17] = 0;
      sign[0x10] = 0;
      sign[0x11] = 0;
      sign[0x12] = 0;
      sign[0x13] = 0;
      sign[0xc] = 0;
      sign[0xd] = 0;
      sign[0xe] = 0;
      sign[0xf] = 0;
      sign[8] = 0;
      sign[9] = 0;
      sign[10] = 0;
      sign[0xb] = 0;
      sign[4] = 0;
      sign[5] = 0;
      sign[6] = 0;
      sign[7] = 0;
      sign[0] = 0;
      sign[1] = 0;
      sign[2] = 0;
      sign[3] = 0;
      baoliSearch(0,curFighterNum,curBomberNum,gridSz);
    }
    lVar6 = std::chrono::_V2::system_clock::now();
    restime.__r = (lVar6 - dVar5.__r) / 1000;
  }
  return fVar15 <= fVar16;
}

Assistant:

bool cal_run(){//if available result
    auto starttime=std::chrono::system_clock::now();
    logtime=starttime;
    //prepare
    int gridSz=gridVec.size(),planeSz=planeVec.size();
    sort(gridVec.begin(),gridVec.end(),cal_cmp_grid);

    //choose fighters.
    int minFighterNum=-1,maxFighterNum=0;

    sort(planeVec.begin(),planeVec.end(),cal_cmp_plane_AS);

    //cal min
    float tAS=PRESET_AS_OF_BOMBER;//AirSupermacy Val
    if(tAS>=tarAirSupremacy)minFighterNum=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
        if(tAS>=tarAirSupremacy&&minFighterNum==-1){
            minFighterNum=i+1;
        }
    }
    //cal max
    tAS=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        if(planeVec[i].category == PLANE_FIGHTER){
            maxFighterNum++;
            planeVecF.push_back(planeVec[i]);
        }
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
    }
    if(tAS<tarAirSupremacy){
        cout<<"ERROR:FighterPower unreachable.Currently reachable FighterPower: "<<tAS<<endl;
        return false;
    }
    maxFighterNum=min(maxFighterNum,16);
    minFighterNum = min(minFighterNum, maxFighterNum);

    //for all possibility
    for(curFighterNum=minFighterNum;curFighterNum<=maxFighterNum;curFighterNum++){
        //choose bombers.
        planeVecA.clear();
        for(int i=0;i<planeSz;i++){
            Plane &tplane=planeVec[i];
            if(tplane.category==PLANE_BOMBER||tplane.category==PLANE_TORPEDO_ATTACKER)
                planeVecA.push_back(tplane);
        }
        sort(planeVecA.begin(),planeVecA.end(),cal_cmp_plane_damage);
        curBomberNum=min(gridSz-curFighterNum,(int)planeVecA.size());
        curBomberNum=min(curBomberNum,attackerAbleGridNum);
        flushFlag=1;//if copy resVecA
//        cout<<curBomberNum<<endl;
//        if(curBomberNum>CBN_LIMIT){
//            cout<<"ERROR:Too much bomber, curBomberNum: "<<curBomberNum<<"  LIMIT: "<<CBN_LIMIT-1<<endl;
//            return false;
//        }

//        cout<<curBomberNum<<endl;
        sort(planeVecA.begin(),planeVecA.begin()+curBomberNum,cal_cmp_plane_damageOP);

        //dfs all bombers assignments
        atkdp(curBomberNum);
//        cout<<"dp finished"<<endl;
        // 0-1 search
        memset(sign,0,sizeof(sign));
        baoliSearch(0,curFighterNum,curBomberNum,gridSz);
    }
    restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now() - starttime);

    return true;
}